

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O3

int do_not(void)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  vm_register *pvVar5;
  undefined4 *puVar6;
  bool bVar7;
  bool bVar8;
  
  pvVar5 = registe_ptr;
  bVar1 = code_ptr[registe_ptr->IP + 1];
  bVar4 = bVar1 >> 4;
  if ((bVar1 & 0xf) == 2) {
    uVar3 = *register_list[bVar4];
    *register_list[bVar4] = ~uVar3;
    bVar8 = SBORROW4(uVar3,-1);
    bVar7 = (int)(uVar3 + 1) < 0;
    if (uVar3 != 0xffffffff) goto LAB_00104433;
  }
  else if ((bVar1 & 0xf) == 1) {
    uVar2 = (ushort)*register_list[bVar4];
    *(ushort *)register_list[bVar4] = ~uVar2;
    bVar8 = SBORROW2(uVar2,-1);
    bVar7 = (short)(uVar2 + 1) < 0;
    if (uVar2 != 0xffff) goto LAB_00104433;
  }
  else {
    if ((bVar1 & 0xf) != 0) {
      puVar6 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar6 = 0xf6;
      __cxa_throw(puVar6,&int::typeinfo,0);
    }
    bVar1 = (byte)*register_list[bVar4];
    *(byte *)register_list[bVar4] = ~bVar1;
    bVar8 = SBORROW1(bVar1,-1);
    bVar7 = (char)(bVar1 + 1) < '\0';
    pvVar5 = registe_ptr;
    if (bVar1 != 0xff) {
LAB_00104433:
      pvVar5->flag[0] = '\x01';
      if (bVar8 != bVar7) {
        pvVar5->flag[1] = '\x01';
        return 1;
      }
      pvVar5->flag[1] = '\0';
      return 1;
    }
  }
  pvVar5->flag[0] = '\0';
  return 1;
}

Assistant:

int do_not(){
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 1] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;
	if (low == 0) {
		char*Ra = (char *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else if (low == 1)
	{
		int16_t*Ra = (int16_t *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else if (low == 2)
	{
		unsigned*Ra = (unsigned *)register_list[high];
		*Ra = ~*Ra;
		set_flag(*Ra);
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}